

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

void __thiscall Catch::XmlReporter::sectionEnded(XmlReporter *this,SectionStats *sectionStats)

{
  int iVar1;
  XmlFormatting fmt;
  StringRef name;
  bool local_a1;
  StringRef local_a0;
  StringRef local_90;
  StringRef local_80;
  StringRef local_70;
  allocator<char> local_49;
  string local_48 [32];
  undefined1 local_28 [8];
  ScopedElement e;
  SectionStats *sectionStats_local;
  XmlReporter *this_local;
  
  e._8_8_ = sectionStats;
  StreamingReporterBase::sectionEnded(&this->super_StreamingReporterBase,sectionStats);
  iVar1 = this->m_sectionDepth + -1;
  this->m_sectionDepth = iVar1;
  if (0 < iVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_48,"OverallResults",&local_49);
    operator|(Newline,Indent);
    XmlWriter::scopedElement((XmlWriter *)local_28,(string *)&this->m_xml,(XmlFormatting)local_48);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator(&local_49);
    local_70 = operator____sr("successes",9);
    XmlWriter::ScopedElement::writeAttribute<unsigned_long,void>
              ((ScopedElement *)local_28,local_70,(unsigned_long *)(e._8_8_ + 0x30));
    local_80 = operator____sr("failures",8);
    XmlWriter::ScopedElement::writeAttribute<unsigned_long,void>
              ((ScopedElement *)local_28,local_80,(unsigned_long *)(e._8_8_ + 0x38));
    local_90 = operator____sr("expectedFailures",0x10);
    XmlWriter::ScopedElement::writeAttribute<unsigned_long,void>
              ((ScopedElement *)local_28,local_90,(unsigned_long *)(e._8_8_ + 0x40));
    local_a0 = operator____sr("skipped",7);
    local_a1 = *(long *)(e._8_8_ + 0x48) != 0;
    XmlWriter::ScopedElement::writeAttribute<bool,void>
              ((ScopedElement *)local_28,local_a0,&local_a1);
    iVar1 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)
              ->_vptr_IConfig[0xb])();
    if (iVar1 == 1) {
      name = operator____sr("durationInSeconds",0x11);
      XmlWriter::ScopedElement::writeAttribute<double,void>
                ((ScopedElement *)local_28,name,(double *)(e._8_8_ + 0x50));
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_28);
    fmt = operator|(Newline,Indent);
    XmlWriter::endElement(&this->m_xml,fmt);
  }
  return;
}

Assistant:

void XmlReporter::sectionEnded( SectionStats const& sectionStats ) {
        StreamingReporterBase::sectionEnded( sectionStats );
        if ( --m_sectionDepth > 0 ) {
            {
                XmlWriter::ScopedElement e = m_xml.scopedElement( "OverallResults" );
                e.writeAttribute( "successes"_sr, sectionStats.assertions.passed );
                e.writeAttribute( "failures"_sr, sectionStats.assertions.failed );
                e.writeAttribute( "expectedFailures"_sr, sectionStats.assertions.failedButOk );
                e.writeAttribute( "skipped"_sr, sectionStats.assertions.skipped > 0 );

                if ( m_config->showDurations() == ShowDurations::Always )
                    e.writeAttribute( "durationInSeconds"_sr, sectionStats.durationInSeconds );
            }
            // Ends assertion tag
            m_xml.endElement();
        }
    }